

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,short>
          (TryCast *this,string_t input,int16_t *result,bool strict)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t iVar7;
  short sVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  byte bVar13;
  int iVar14;
  long lVar15;
  char cVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  IntegerCastData<short> local_7c;
  IntegerCastData<short> local_7a;
  IntegerDecimalCastData<short> local_78;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = input.value._0_8_;
  lVar20 = input.value._0_8_;
  if (((ulong)this & 0xffffffff) < 0xd) {
    lVar20 = (long)&local_40 + 4;
  }
  uVar18 = (ulong)this & 0xffffffff;
  if (uVar18 != 0) {
    bVar1 = SUB81(result,0);
    uVar5 = 0;
    do {
      bVar2 = *(byte *)(lVar20 + uVar5);
      local_40 = this;
      if ((4 < bVar2 - 9) && (bVar2 != 0x20)) {
        local_7c.result = 0;
        if (bVar2 == 0x2d) {
          bVar21 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             ((char *)(lVar20 + uVar5),uVar18 - uVar5,&local_7c,bVar1);
          goto LAB_00287d9d;
        }
        if (bVar2 == 0x30 && uVar18 - 1 != uVar5) {
          bVar2 = *(byte *)(lVar20 + 1 + uVar5);
          if (bVar2 < 0x62) {
            if (bVar2 == 0x42) {
LAB_00287eed:
              uVar6 = ~uVar5 + uVar18;
              bVar21 = uVar6 >= 2;
              if (uVar6 < 2) goto LAB_00287d9d;
              uVar10 = 1;
              local_7c.result = 0;
              goto LAB_00287f0a;
            }
            if (bVar2 == 0x58) {
LAB_00287dc3:
              uVar6 = 1;
              iVar14 = 0;
              iVar9 = 0;
              goto LAB_00287dd6;
            }
          }
          else {
            if (bVar2 == 0x62) goto LAB_00287eed;
            if (bVar2 == 0x78) goto LAB_00287dc3;
          }
          if (((byte)(bVar2 - 0x30) < 10 & bVar1) != 0) break;
        }
        bVar21 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)(lVar20 + uVar5),uVar18 - uVar5,&local_7c,bVar1);
        goto LAB_00287d9d;
      }
      uVar5 = uVar5 + 1;
    } while (uVar18 != uVar5);
    goto LAB_00287f99;
  }
  goto LAB_0028882b;
LAB_00287dd6:
  do {
    local_7c.result = (ResultType_conflict)iVar14;
    if (~uVar5 + uVar18 <= uVar6) {
      bVar21 = 1 < uVar6;
LAB_00287d9d:
      if (bVar21 != false) goto LAB_00287da5;
      break;
    }
    lVar3 = uVar6 + lVar20;
    bVar2 = *(byte *)(uVar5 + 1 + lVar3);
    bVar13 = bVar2 | 0x20;
    if (0x19 < (byte)(bVar2 + 0xbf)) {
      bVar13 = bVar2;
    }
    if ((9 < (byte)(bVar13 - 0x30)) &&
       ((0x25 < bVar13 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar13 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar16 = -0x57;
    if ((char)bVar13 < 'a') {
      cVar16 = -0x30;
    }
    lVar15 = uVar18 - uVar6;
    uVar10 = uVar6 + 1;
    if ((lVar15 - 2U == uVar5) || (*(char *)(uVar5 + 2 + lVar3) != '_')) {
LAB_00287ea7:
      uVar6 = uVar10;
      bVar21 = (int)(short)iVar9 <= (int)((byte)(cVar16 + bVar13) >> 4 ^ 0x7ff);
      if (bVar21) {
        iVar14 = (short)iVar9 * 0x10 + (uint)(byte)(cVar16 + bVar13);
        iVar9 = iVar14;
      }
    }
    else {
      uVar6 = uVar6 + 2;
      if (lVar15 - 3U != uVar5) {
        bVar2 = *(byte *)(uVar5 + 3 + lVar3);
        uVar10 = uVar6;
        if (9 < (byte)(bVar2 - 0x30)) {
          bVar21 = false;
          uVar17 = bVar2 - 0x41;
          if ((0x25 < uVar17) || ((0x3f0000003fU >> ((ulong)uVar17 & 0x3f) & 1) == 0))
          goto LAB_00287eda;
        }
        goto LAB_00287ea7;
      }
      bVar21 = false;
    }
LAB_00287eda:
    local_7c.result = (ResultType_conflict)iVar14;
  } while (bVar21);
LAB_00287f99:
  if (uVar18 != 0) {
    uVar5 = 0;
    do {
      bVar2 = *(byte *)(lVar20 + uVar5);
      if ((4 < bVar2 - 9) && (bVar2 != 0x20)) {
        local_78.result = 0;
        local_78.decimal = 0;
        local_78._16_8_ = 0;
        uVar6 = uVar18 - uVar5;
        if (bVar2 == 0x2d) {
          uVar10 = 1;
          local_78.result = 0;
          goto LAB_00288002;
        }
        if (bVar2 == 0x30 && uVar18 - 1 != uVar5) {
          bVar13 = *(byte *)(lVar20 + 1 + uVar5);
          if (bVar13 < 0x62) {
            if (bVar13 == 0x42) {
LAB_002883ef:
              uVar6 = ~uVar5 + uVar18;
              if (uVar6 < 2) goto LAB_00288497;
              uVar10 = 1;
              local_78.result = 0;
              goto LAB_00288416;
            }
            if (bVar13 == 0x58) {
LAB_002882d0:
              local_78.result = 0;
              uVar6 = 1;
              goto LAB_002882f8;
            }
          }
          else {
            if (bVar13 == 0x62) goto LAB_002883ef;
            if (bVar13 == 0x78) goto LAB_002882d0;
          }
          if (((byte)(bVar13 - 0x30) < 10 & bVar1) != 0) break;
        }
        if ((bVar2 == 0x2b & bVar1) == 0) {
          local_58 = (ulong)(bVar2 == 0x2b);
          local_78.result = 0;
          uVar10 = local_58;
          goto LAB_00288126;
        }
        break;
      }
      uVar5 = uVar5 + 1;
    } while (uVar18 != uVar5);
  }
  goto LAB_0028882b;
  while( true ) {
    uVar11 = uVar10 + 1;
    if (local_78.result < (long)((ulong)bVar2 + 0x8000000000000000) / 10) {
      bVar21 = false;
    }
    else {
      local_78.result = local_78.result * 10 - (ulong)bVar2;
      bVar21 = true;
      if ((~uVar10 + uVar18 != uVar5) &&
         (*(char *)(uVar5 + 1 + uVar10 + lVar20) == '_' && bVar1 == false)) {
        uVar11 = uVar10 + 2;
        if ((uVar18 - uVar10) - 2 == uVar5) {
          bVar21 = false;
        }
        else {
          bVar21 = (byte)(*(char *)(uVar5 + lVar20 + uVar11) - 0x30U) < 10;
        }
      }
    }
    uVar10 = uVar11;
    if (!bVar21) break;
LAB_00288002:
    if (uVar6 <= uVar10) goto LAB_002881cf;
    cVar16 = *(char *)(uVar5 + uVar10 + lVar20);
    bVar2 = cVar16 - 0x30;
    if (9 < bVar2) {
      if (cVar16 != '.') goto LAB_002884b7;
      if (bVar1 == false) {
        uVar11 = uVar10 + 1;
        iVar9 = 3;
        uVar4 = uVar11;
        if (uVar6 <= uVar11) goto LAB_00288722;
        local_78.decimal = 0;
        local_58 = local_58 & 0xffffffff00000000;
        goto LAB_0028822f;
      }
      break;
    }
  }
  goto LAB_0028882b;
  while (uVar4 = uVar19, uVar19 < uVar6) {
LAB_0028822f:
    bVar2 = *(char *)(uVar5 + uVar4 + lVar20) - 0x30;
    local_50 = uVar11;
    if (9 < bVar2) {
      iVar9 = 0;
      goto LAB_0028870d;
    }
    if (local_78.decimal <= (long)(((ulong)bVar2 ^ 0x7ffffffffffffffe) / 10)) {
      local_58 = CONCAT44(local_58._4_4_,(int)local_58 + 1);
      local_78.decimal = (ulong)bVar2 + local_78.decimal * 10;
    }
    uVar19 = uVar4 + 1;
    if (((~uVar4 + uVar18 != uVar5) && (*(char *)(uVar5 + 1 + uVar4 + lVar20) == '_')) &&
       ((uVar19 = uVar4 + 2, (uVar18 - uVar4) - 2 == uVar5 ||
        (9 < (byte)(*(char *)(uVar5 + lVar20 + uVar19) - 0x30U))))) {
      local_78._16_8_ = local_58 & 0xffff;
      uVar4 = uVar19;
      iVar14 = 1;
      goto LAB_0028873a;
    }
  }
  iVar9 = 3;
LAB_0028870d:
  local_78._16_8_ = local_58 & 0xffff;
LAB_00288722:
  iVar14 = 1;
  if (uVar11 < uVar4) {
    iVar14 = iVar9;
  }
  if (1 < uVar10) {
    iVar14 = iVar9;
  }
LAB_0028873a:
  uVar10 = uVar4;
  if (iVar14 != 3) {
    if (iVar14 != 0) goto LAB_0028882b;
LAB_002884b7:
    bVar2 = *(byte *)(uVar5 + lVar20 + uVar10);
    bVar21 = false;
    uVar17 = (uint)bVar2;
    if (bVar2 < 0x20) {
      if (4 < uVar17 - 9) goto LAB_0028882e;
    }
    else {
      if ((bVar2 == 0x65) || (uVar17 == 0x45)) {
        if ((uVar10 != 1 && bVar1 == false) && (uVar10 + 1 < uVar6)) {
          local_7a.result = 0;
          pcVar12 = (char *)(uVar5 + lVar20 + uVar10 + 1);
          iVar7 = ~uVar5 + (uVar18 - uVar10);
          if (*pcVar12 == '-') {
            bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar12,iVar7,&local_7a,false);
          }
          else {
            bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar12,iVar7,&local_7a,false);
          }
          bVar21 = false;
          if (bVar1 != false) {
            bVar21 = IntegerDecimalCastOperation::
                     HandleExponent<duckdb::IntegerDecimalCastData<short>,true>
                               (&local_78,local_7a.result);
          }
          goto LAB_0028882e;
        }
        goto LAB_0028882b;
      }
      if (uVar17 != 0x20) goto LAB_0028882e;
    }
    uVar18 = uVar10 + 1;
    uVar10 = uVar18;
    if (uVar18 < uVar6) {
      do {
        bVar2 = *(byte *)(uVar5 + lVar20 + uVar18);
        if ((4 < bVar2 - 9) && (bVar2 != 0x20)) goto LAB_0028882b;
        uVar18 = uVar18 + 1;
        uVar10 = uVar6;
      } while (uVar6 != uVar18);
    }
  }
LAB_002881cf:
  bVar1 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,true>
                    (&local_78);
  if (bVar1) {
    bVar21 = 1 < uVar10;
    goto LAB_0028882e;
  }
  goto LAB_0028882b;
  while( true ) {
    uVar11 = uVar10 + 1;
    if (((uVar18 - uVar10) - 2 != uVar5) && (*(char *)(uVar5 + 2 + lVar3) == '_')) {
      if (((uVar18 - uVar10) - 3 == uVar5) || ((*(byte *)(uVar5 + 3 + lVar3) & 0xfe) != 0x30))
      goto LAB_0028882b;
      uVar11 = uVar10 + 2;
    }
    uVar10 = uVar11;
    if (0x3fffffffffffffff < local_78.result) goto LAB_0028882b;
    local_78.result = lVar15 + local_78.result * 2;
    if (uVar6 <= uVar10) break;
LAB_00288416:
    lVar3 = uVar10 + lVar20;
    cVar16 = *(char *)(uVar5 + 1 + lVar3);
    if (cVar16 == '0') {
      lVar15 = 0;
    }
    else {
      if (cVar16 != '1') goto LAB_0028882b;
      lVar15 = 1;
    }
  }
LAB_00288497:
  bVar21 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                     (&local_78);
  bVar21 = bVar21 && 1 < uVar6;
  goto LAB_0028882e;
LAB_002882f8:
  do {
    if (~uVar5 + uVar18 <= uVar6) {
      bVar21 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                         (&local_78);
      bVar21 = 1 < uVar6 && bVar21;
      goto LAB_0028882e;
    }
    lVar3 = uVar6 + lVar20;
    bVar2 = *(byte *)(uVar5 + 1 + lVar3);
    bVar13 = bVar2 | 0x20;
    if (0x19 < (byte)(bVar2 + 0xbf)) {
      bVar13 = bVar2;
    }
    if ((9 < (byte)(bVar13 - 0x30)) &&
       ((0x25 < bVar13 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar13 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar16 = -0x57;
    if ((char)bVar13 < 'a') {
      cVar16 = -0x30;
    }
    uVar10 = uVar6 + 1;
    if (((uVar18 - uVar6) - 2 == uVar5) || (*(char *)(uVar5 + 2 + lVar3) != '_')) {
LAB_002883b5:
      uVar6 = (ulong)((byte)(cVar16 + bVar13) >> 4) ^ 0x7ffffffffffffff;
      lVar3 = local_78.result;
      if (local_78.result <= (long)uVar6) {
        lVar3 = local_78.result * 0x10 + (ulong)(byte)(cVar16 + bVar13);
      }
      bVar1 = local_78.result <= (long)uVar6;
      local_78.result = lVar3;
    }
    else {
      uVar10 = uVar6 + 2;
      if ((uVar18 - uVar6) - 3 != uVar5) {
        bVar2 = *(byte *)(uVar5 + 3 + lVar3);
        if (9 < (byte)(bVar2 - 0x30)) {
          uVar17 = bVar2 - 0x41;
          bVar1 = false;
          if ((0x25 < uVar17) || (bVar1 = false, (0x3f0000003fU >> ((ulong)uVar17 & 0x3f) & 1) == 0)
             ) goto LAB_002883dc;
        }
        goto LAB_002883b5;
      }
      bVar1 = false;
    }
LAB_002883dc:
    uVar6 = uVar10;
  } while (bVar1);
  goto LAB_0028882b;
  while( true ) {
    uVar11 = uVar10 + 1;
    if ((long)(((ulong)bVar2 ^ 0x7ffffffffffffffe) / 10) < local_78.result) {
      bVar21 = false;
    }
    else {
      local_78.result = (ulong)bVar2 + local_78.result * 10;
      bVar21 = true;
      if ((~uVar10 + uVar18 != uVar5) &&
         (*(char *)(uVar5 + 1 + uVar10 + lVar20) == '_' && bVar1 == false)) {
        uVar11 = uVar10 + 2;
        if ((uVar18 - uVar10) - 2 == uVar5) {
          bVar21 = false;
        }
        else {
          bVar21 = (byte)(*(char *)(uVar5 + lVar20 + uVar11) - 0x30U) < 10;
        }
      }
    }
    uVar10 = uVar11;
    if (!bVar21) break;
LAB_00288126:
    if (uVar6 <= uVar10) goto LAB_0028852f;
    cVar16 = *(char *)(uVar5 + uVar10 + lVar20);
    bVar2 = cVar16 - 0x30;
    if (9 < bVar2) {
      if (cVar16 != '.') goto LAB_0028864c;
      if (bVar1 == false) {
        uVar11 = uVar10 + 1;
        iVar9 = 3;
        uVar4 = uVar11;
        if (uVar6 <= uVar11) goto LAB_00288804;
        local_78.decimal = 0;
        local_50 = local_50 & 0xffffffff00000000;
        goto LAB_00288590;
      }
      break;
    }
  }
  goto LAB_0028882b;
  while( true ) {
    uVar11 = uVar10 + 1;
    if (((uVar18 - uVar10) - 2 != uVar5) && (*(char *)(uVar5 + 2 + lVar3) == '_')) {
      if (((uVar18 - uVar10) - 3 == uVar5) || ((*(byte *)(uVar5 + 3 + lVar3) & 0xfe) != 0x30))
      goto LAB_00287f99;
      uVar11 = uVar10 + 2;
    }
    uVar10 = uVar11;
    if (0x3fff < local_7c.result) goto LAB_00287f99;
    local_7c.result = sVar8 + local_7c.result * 2;
    if (uVar6 <= uVar10) break;
LAB_00287f0a:
    lVar3 = uVar10 + lVar20;
    cVar16 = *(char *)(uVar5 + 1 + lVar3);
    if (cVar16 == '0') {
      sVar8 = 0;
    }
    else {
      if (cVar16 != '1') goto LAB_00287f99;
      sVar8 = 1;
    }
  }
LAB_00287da5:
  *input.value._8_8_ = local_7c.result;
  return true;
  while (uVar4 = uVar19, uVar19 < uVar6) {
LAB_00288590:
    bVar2 = *(char *)(uVar5 + uVar4 + lVar20) - 0x30;
    local_48 = uVar11;
    if (9 < bVar2) {
      iVar9 = 0;
      goto LAB_002887f1;
    }
    if (local_78.decimal <= (long)(((ulong)bVar2 ^ 0x7ffffffffffffffe) / 10)) {
      local_50 = CONCAT44(local_50._4_4_,(int)local_50 + 1);
      local_78.decimal = (ulong)bVar2 + local_78.decimal * 10;
    }
    uVar19 = uVar4 + 1;
    if (((~uVar4 + uVar18 != uVar5) && (*(char *)(uVar5 + 1 + uVar4 + lVar20) == '_')) &&
       ((uVar19 = uVar4 + 2, (uVar18 - uVar4) - 2 == uVar5 ||
        (9 < (byte)(*(char *)(uVar5 + lVar20 + uVar19) - 0x30U))))) {
      local_78._16_8_ = local_50 & 0xffff;
      uVar4 = uVar19;
      iVar14 = 1;
      goto LAB_0028881a;
    }
  }
  iVar9 = 3;
LAB_002887f1:
  local_78._16_8_ = local_50 & 0xffff;
LAB_00288804:
  iVar14 = 1;
  if (uVar11 < uVar4) {
    iVar14 = iVar9;
  }
  if (local_58 < uVar10) {
    iVar14 = iVar9;
  }
LAB_0028881a:
  uVar10 = uVar4;
  if (iVar14 != 3) {
    if (iVar14 != 0) goto LAB_0028882b;
LAB_0028864c:
    bVar2 = *(byte *)(uVar5 + lVar20 + uVar10);
    bVar21 = false;
    uVar17 = (uint)bVar2;
    if (bVar2 < 0x20) {
      if (4 < uVar17 - 9) goto LAB_0028882e;
    }
    else {
      if ((bVar2 == 0x65) || (uVar17 == 0x45)) {
        if ((uVar10 != local_58 && bVar1 == false) && (uVar10 + 1 < uVar6)) {
          local_7a.result = 0;
          pcVar12 = (char *)(uVar5 + lVar20 + uVar10 + 1);
          iVar7 = ~uVar5 + (uVar18 - uVar10);
          if (*pcVar12 == '-') {
            bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar12,iVar7,&local_7a,false);
          }
          else {
            bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar12,iVar7,&local_7a,false);
          }
          bVar21 = false;
          if (bVar1 != false) {
            bVar21 = IntegerDecimalCastOperation::
                     HandleExponent<duckdb::IntegerDecimalCastData<short>,false>
                               (&local_78,local_7a.result);
          }
          goto LAB_0028882e;
        }
        goto LAB_0028882b;
      }
      if (uVar17 != 0x20) goto LAB_0028882e;
    }
    uVar18 = uVar10 + 1;
    uVar10 = uVar18;
    if (uVar18 < uVar6) {
      do {
        bVar2 = *(byte *)(uVar5 + lVar20 + uVar18);
        if ((4 < bVar2 - 9) && (bVar2 != 0x20)) goto LAB_0028882b;
        uVar18 = uVar18 + 1;
        uVar10 = uVar6;
      } while (uVar6 != uVar18);
    }
  }
LAB_0028852f:
  bVar1 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                    (&local_78);
  if (bVar1) {
    bVar21 = local_58 < uVar10;
    goto LAB_0028882e;
  }
LAB_0028882b:
  bVar21 = false;
LAB_0028882e:
  if (bVar21 != false) {
    *input.value._8_8_ = (short)local_78.result;
  }
  return bVar21;
}

Assistant:

bool TryCast::Operation(string_t input, int16_t &result, bool strict) {
	return TrySimpleIntegerCast<int16_t>(input.GetData(), input.GetSize(), result, strict);
}